

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_DestroyWindow(ImGuiViewport *viewport)

{
  undefined8 *puVar1;
  long in_RDI;
  GLFWwindow *unaff_retaddr;
  ImGuiViewportDataGlfw *data;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x38);
  if (puVar1 != (undefined8 *)0x0) {
    if ((*(byte *)(puVar1 + 1) & 1) != 0) {
      glfwDestroyWindow(unaff_retaddr);
    }
    *puVar1 = 0;
    IM_DELETE<ImGuiViewportDataGlfw>((ImGuiViewportDataGlfw *)0x232e5d);
  }
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  return;
}

Assistant:

static void ImGui_ImplGlfw_DestroyWindow(ImGuiViewport* viewport)
{
    if (ImGuiViewportDataGlfw* data = (ImGuiViewportDataGlfw*)viewport->PlatformUserData)
    {
        if (data->WindowOwned)
        {
#if GLFW_HAS_GLFW_HOVERED && defined(_WIN32)
            HWND hwnd = (HWND)viewport->PlatformHandleRaw;
            ::RemovePropA(hwnd, "IMGUI_VIEWPORT");
#endif
            glfwDestroyWindow(data->Window);
        }
        data->Window = NULL;
        IM_DELETE(data);
    }
    viewport->PlatformUserData = viewport->PlatformHandle = NULL;
}